

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureTest.cpp
# Opt level: O1

void __thiscall
TEST_TestFailure_CheckEqualFailure_Test::testBody(TEST_TestFailure_CheckEqualFailure_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  CheckEqualFailure f;
  undefined1 local_a8 [152];
  
  pUVar1 = (this->super_TEST_GROUP_CppUTestGroupTestFailure).test;
  SimpleString::SimpleString((SimpleString *)local_a8,"expected");
  SimpleString::SimpleString((SimpleString *)(local_a8 + 0x10),"actual");
  SimpleString::SimpleString((SimpleString *)(local_a8 + 0x20),"");
  CheckEqualFailure::CheckEqualFailure
            ((CheckEqualFailure *)(local_a8 + 0x30),pUVar1,"fail.cpp",2,(SimpleString *)local_a8,
             (SimpleString *)(local_a8 + 0x10),(SimpleString *)(local_a8 + 0x20));
  SimpleString::~SimpleString((SimpleString *)(local_a8 + 0x20));
  SimpleString::~SimpleString((SimpleString *)(local_a8 + 0x10));
  SimpleString::~SimpleString((SimpleString *)local_a8);
  pUVar1 = UtestShell::getCurrent();
  TestFailure::getMessage((TestFailure *)local_a8);
  pcVar2 = SimpleString::asCharString((SimpleString *)local_a8);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,
             "expected <expected>\n\tbut was  <actual>\n\tdifference starts at position 0 at: <          actual    >\n\t                                               ^"
             ,pcVar2,"",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestFailureTest.cpp"
             ,0x6b,pTVar3);
  SimpleString::~SimpleString((SimpleString *)local_a8);
  TestFailure::~TestFailure((TestFailure *)(local_a8 + 0x30));
  return;
}

Assistant:

TEST(TestFailure, CheckEqualFailure)
{
    CheckEqualFailure f(test, failFileName, failLineNumber, "expected", "actual", "");
    FAILURE_EQUAL("expected <expected>\n"
                  "\tbut was  <actual>\n"
                  "\tdifference starts at position 0 at: <          actual    >\n"
                  "\t                                               ^", f);
}